

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DeferredTypeHandlerBase::Convert
          (DeferredTypeHandlerBase *this,DynamicObject *instance,DeferredInitializeMode mode,
          int initSlotCapacity,BOOL hasAccessor)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint isProto;
  
  if (*(DeferredTypeHandlerBase **)((instance->super_RecyclableObject).type.ptr + 1) != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x50,"(instance->GetDynamicType()->GetTypeHandler() == this)",
                                "instance->GetDynamicType()->GetTypeHandler() == this");
    if (!bVar2) goto LAB_00da59df;
    *puVar3 = 0;
  }
  bVar2 = hasAccessor == 0;
  if (mode == DeferredInitializeMode_Extensions) {
LAB_00da5956:
    bVar2 = false;
  }
  else {
    if (mode == DeferredInitializeMode_SetAccessors) {
      initSlotCapacity = initSlotCapacity + 2;
      goto LAB_00da5956;
    }
    if (mode == DeferredInitializeMode_Set) {
      initSlotCapacity = initSlotCapacity + 1;
    }
  }
  isProto = (this->super_DynamicTypeHandler).flags & 0x20;
  if (bVar2) {
    ConvertToSimpleDictionaryType(this,instance,initSlotCapacity,isProto);
  }
  else {
    ConvertToDictionaryType(this,instance,initSlotCapacity,isProto);
  }
  bVar2 = DynamicObject::HasSharedType(instance);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x6d,"(!instance->HasSharedType())",
                                "Expect the instance to have a non-shared type and handler after conversion."
                               );
    if (!bVar2) {
LAB_00da59df:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void DeferredTypeHandlerBase::Convert(DynamicObject * instance, DeferredInitializeMode mode, int initSlotCapacity, BOOL hasAccessor)
    {
        Assert(instance->GetDynamicType()->GetTypeHandler() == this);

        BOOL isProto = (GetFlags() & IsPrototypeFlag);
        BOOL isSimple = !hasAccessor;

        switch (mode)
        {
        case DeferredInitializeMode_Set:
            initSlotCapacity++;
            break;
        case DeferredInitializeMode_SetAccessors:
            initSlotCapacity += 2;
            // fall-through
        case DeferredInitializeMode_Extensions:
            isSimple = FALSE;
            break;
        }

        DynamicTypeHandler* newTypeHandler;

        if (isSimple)
        {
            newTypeHandler = ConvertToSimpleDictionaryType(instance, initSlotCapacity, isProto);
        }
        else
        {
            newTypeHandler = ConvertToDictionaryType(instance, initSlotCapacity, isProto);
        }

        AssertMsg(!instance->HasSharedType(), "Expect the instance to have a non-shared type and handler after conversion.");
    }